

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_setRleBlock(void *dst,size_t dstCapacity,BYTE b,size_t regenSize)

{
  size_t regenSize_local;
  BYTE b_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  if (dst == (void *)0x0) {
    if (regenSize == 0) {
      dst_local = (void *)0x0;
    }
    else {
      dst_local = (void *)0xffffffffffffffb6;
    }
  }
  else if (dstCapacity < regenSize) {
    dst_local = (void *)0xffffffffffffffba;
  }
  else {
    memset(dst,(uint)b,regenSize);
    dst_local = (void *)regenSize;
  }
  return (size_t)dst_local;
}

Assistant:

static size_t ZSTD_setRleBlock(void* dst, size_t dstCapacity,
                               BYTE b,
                               size_t regenSize)
{
    if (dst == NULL) {
        if (regenSize == 0) return 0;
        return ERROR(dstBuffer_null);
    }
    if (regenSize > dstCapacity) return ERROR(dstSize_tooSmall);
    memset(dst, b, regenSize);
    return regenSize;
}